

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
Net::propagate_back(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Net *this,
                   int cur_layer,vector<double,_std::allocator<double>_> *y,
                   vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   *derivative,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *bias_derivative)

{
  double dVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_c8;
  vector<double,_std::allocator<double>_> local_c0;
  int local_a4;
  undefined1 local_a0 [4];
  int j;
  double local_88;
  undefined1 local_80 [8];
  Layer lol;
  int i;
  allocator<double> local_52;
  undefined1 local_51;
  vector<double,_std::allocator<double>_> local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_38;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *bias_derivative_local;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *derivative_local;
  vector<double,_std::allocator<double>_> *y_local;
  Net *pNStack_18;
  int cur_layer_local;
  Net *this_local;
  vector<double,_std::allocator<double>_> *y_prev;
  
  local_38 = bias_derivative;
  bias_derivative_local =
       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)derivative;
  derivative_local =
       (vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        *)y;
  y_local._4_4_ = cur_layer;
  pNStack_18 = this;
  this_local = (Net *)__return_storage_ptr__;
  sVar2 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->mesh);
  if ((long)cur_layer != sVar2 - 1) {
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,(long)y_local._4_4_);
    add_matrix<double>(&local_50,y,pvVar3);
    std::vector<double,_std::allocator<double>_>::operator=(y,&local_50);
    std::vector<double,_std::allocator<double>_>::~vector(&local_50);
  }
  local_51 = 0;
  pvVar3 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->mesh,(long)(y_local._4_4_ + -1));
  sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
  std::allocator<double>::allocator(&local_52);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,sVar2,&local_52);
  std::allocator<double>::~allocator(&local_52);
  lol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  while( true ) {
    uVar4 = (ulong)(int)lol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,(long)y_local._4_4_);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
    if (sVar2 <= uVar4) break;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,(long)(y_local._4_4_ + -1));
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->meshZ,(long)y_local._4_4_);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar5,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar8 = derivative_function(this,*pvVar6);
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,(long)y_local._4_4_);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar5,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (y,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage);
    local_88 = (dVar8 + dVar8) * (dVar1 - *pvVar6);
    mult_matrix_on_constant<double>
              ((vector<double,_std::allocator<double>_> *)local_80,pvVar3,&local_88);
    pvVar7 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           *)bias_derivative_local,(long)y_local._4_4_);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](pvVar7,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    add_matrix<double>((vector<double,_std::allocator<double>_> *)local_a0,pvVar3,
                       (vector<double,_std::allocator<double>_> *)local_80);
    pvVar7 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           *)bias_derivative_local,(long)y_local._4_4_);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](pvVar7,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::operator=
              (pvVar3,(vector<double,_std::allocator<double>_> *)local_a0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_a0);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->meshZ,(long)y_local._4_4_);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar3,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar9 = derivative_function(this,*pvVar6);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,(long)y_local._4_4_);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar3,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (y,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage);
    dVar8 = *pvVar6;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](local_38,(long)y_local._4_4_);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar3,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    *pvVar6 = dVar9 * 2.0 * (dVar1 - dVar8) + *pvVar6;
    local_a4 = 0;
    while( true ) {
      uVar4 = (ulong)local_a4;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->mesh,(long)(y_local._4_4_ + -1));
      sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
      if (sVar2 <= uVar4) break;
      pvVar7 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->weights,(long)y_local._4_4_);
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar7,(long)(int)lol.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_a4);
      dVar1 = *pvVar6;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->meshZ,(long)y_local._4_4_);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar3,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      dVar10 = derivative_function(this,*pvVar6);
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->mesh,(long)y_local._4_4_);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar3,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      dVar8 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (y,(long)(int)lol.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      dVar9 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (__return_storage_ptr__,
                          (long)(int)lol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage);
      *pvVar6 = (dVar1 + dVar1) * dVar10 * (dVar8 - dVar9) + *pvVar6;
      local_a4 = local_a4 + 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_80);
    lol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)lol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1;
  }
  local_c8 = -1.0;
  mult_matrix_on_constant<double>(&local_c0,__return_storage_ptr__,&local_c8);
  std::vector<double,_std::allocator<double>_>::operator=(__return_storage_ptr__,&local_c0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Net::propagate_back(int cur_layer, std::vector<double> y, std::vector<std::vector<Layer> >& derivative, std::vector<Layer>& bias_derivative){
    if (cur_layer != mesh.size()-1) y = add_matrix(y, mesh[cur_layer]);
    std::vector<double> y_prev(mesh[cur_layer-1].size());
    for (int i = 0; i < mesh[cur_layer].size(); ++i) {
        Layer lol = mult_matrix_on_constant(mesh[cur_layer-1], (2 * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i])));
        derivative[cur_layer][i] = add_matrix(derivative[cur_layer][i], lol);
        bias_derivative[cur_layer][i] += (2 * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i]));
        for (int j = 0; j < mesh[cur_layer-1].size(); ++j)
            y_prev[i] += (2 * weights[cur_layer][i][j] * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i]));

//        threshold(derivative[cur_layer][i], MOD); derivative_function
    }
//    threshold(y_prev, 1.0);
//    threshold(bias_derivative[cur_layer], MOD);
    y_prev = mult_matrix_on_constant(y_prev, -1.0);
    return y_prev;
}